

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void Diligent::ParseAttributesInComment
               (String *Comment,
               unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *Attributes)

{
  char cVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  size_type sVar3;
  char *pcVar4;
  pointer pcVar5;
  const_iterator Pos;
  String Attrib;
  String Value;
  pair<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  HashMapStringKey local_40;
  
  Pos._M_current = (Comment->_M_dataplus)._M_p;
  local_70.first.Str = Pos._M_current + Comment->_M_string_length;
  _Var2 = Parsing::SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (&Pos,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_70,(char *)0x0);
  pcVar5 = (Comment->_M_dataplus)._M_p;
  sVar3 = Comment->_M_string_length;
  if ((((_Var2._M_current != pcVar5 + sVar3) && (*_Var2._M_current == '/')) &&
      (_Var2._M_current + 1 != pcVar5 + sVar3)) &&
     ((cVar1 = _Var2._M_current[1], cVar1 == '/' || (cVar1 == '*')))) {
    Pos._M_current = _Var2._M_current + 2;
    while (local_70.first.Str = pcVar5 + sVar3, Pos._M_current != local_70.first.Str) {
      _Var2 = Parsing::
              SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (&Pos,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_70,(char *)0x0);
      local_70.first.Str = (Comment->_M_dataplus)._M_p + Comment->_M_string_length;
      if (_Var2._M_current == local_70.first.Str) {
        return;
      }
      Pos._M_current = _Var2._M_current;
      Pos._M_current =
           (char *)Parsing::
                   SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                             (&Pos,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_70);
      Attrib._M_dataplus._M_p = (pointer)&Attrib.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&Attrib,_Var2._M_current,Pos._M_current);
      local_70.first.Str = (Comment->_M_dataplus)._M_p + Comment->_M_string_length;
      Pos._M_current =
           (char *)Parsing::
                   SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                             (&Pos,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_70,(char *)0x0);
      pcVar4 = (Comment->_M_dataplus)._M_p + Comment->_M_string_length;
      if ((Pos._M_current == pcVar4) || (*Pos._M_current != '=')) {
LAB_002a20f1:
        std::__cxx11::string::~string((string *)&Attrib);
        return;
      }
      Pos._M_current = Pos._M_current + 1;
      local_70.first.Str = pcVar4;
      _Var2 = Parsing::
              SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (&Pos,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_70,(char *)0x0);
      pcVar4 = (Comment->_M_dataplus)._M_p + Comment->_M_string_length;
      Pos._M_current = _Var2._M_current;
      if (_Var2._M_current == pcVar4) goto LAB_002a20f1;
      local_70.first.Str = pcVar4;
      Pos._M_current =
           (char *)Parsing::
                   SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                             (&Pos,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_70);
      Value._M_dataplus._M_p = (pointer)&Value.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&Value,_Var2._M_current,Pos._M_current);
      HashMapStringKey::HashMapStringKey(&local_40,Attrib._M_dataplus._M_p,true);
      std::
      pair<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_70,&local_40,&Value);
      std::
      _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<Diligent::HashMapStringKey,std::__cxx11::string>>
                ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)Attributes,&local_70);
      std::
      pair<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_70);
      HashMapStringKey::Clear(&local_40);
      local_70.first.Str = (Comment->_M_dataplus)._M_p + Comment->_M_string_length;
      Pos._M_current =
           (char *)Parsing::
                   SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                             (&Pos,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_70,(char *)0x0);
      if ((Pos._M_current == (Comment->_M_dataplus)._M_p + Comment->_M_string_length) ||
         ((*Pos._M_current != ';' && (*Pos._M_current != ',')))) {
        std::__cxx11::string::~string((string *)&Value);
        goto LAB_002a20f1;
      }
      Pos._M_current = Pos._M_current + 1;
      std::__cxx11::string::~string((string *)&Value);
      std::__cxx11::string::~string((string *)&Attrib);
      sVar3 = Comment->_M_string_length;
      pcVar5 = (Comment->_M_dataplus)._M_p;
    }
  }
  return;
}

Assistant:

void ParseAttributesInComment(const String& Comment, std::unordered_map<HashMapStringKey, String>& Attributes)
{
    auto Pos = Comment.begin();
    //    /* partitioning = fractional_even, outputtopology = triangle_cw */
    // ^
    Pos = SkipDelimiters(Pos, Comment.end());
    if (Pos == Comment.end())
        return;
    //    /* partitioning = fractional_even, outputtopology = triangle_cw */
    //    ^
    if (*Pos != '/')
        return;
    ++Pos;
    //    /* partitioning = fractional_even, outputtopology = triangle_cw */
    //     ^
    //    // partitioning = fractional_even, outputtopology = triangle_cw */
    //     ^
    if (Pos == Comment.end() || (*Pos != '/' && *Pos != '*'))
        return;
    ++Pos;
    while (Pos != Comment.end())
    {
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //      ^
        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //       ^
        auto AttribStart = Pos;
        Pos              = SkipIdentifier(Pos, Comment.end());
        String Attrib(AttribStart, Pos);
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                   ^
        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                    ^
        if (*Pos != '=')
            return;
        ++Pos;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                     ^
        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                     ^
        auto ValueStartPos = Pos;
        Pos                = SkipIdentifier(Pos, Comment.end());
        //    /* partitioning = fractional_even , outputtopology = triangle_cw */
        //                                     ^
        String Value(ValueStartPos, Pos);
        Attributes.emplace(make_pair(HashMapStringKey(std::move(Attrib)), Value));

        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even , outputtopology = triangle_cw */
        //                                      ^
        if (*Pos != ',' && *Pos != ';')
            return;
        ++Pos;
        //    /* partitioning = fractional_even , outputtopology = triangle_cw */
        //                                       ^
    }
}